

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void * sqlite3Realloc(void *pOld,u64 nBytes)

{
  int iVar1;
  int iVar2;
  void *pvVar3;
  sqlite3StatValueType newValue;
  
  if (pOld == (void *)0x0) {
    pvVar3 = sqlite3Malloc(nBytes);
    return pvVar3;
  }
  if (nBytes == 0) {
    sqlite3_free(pOld);
  }
  else if (nBytes < 0x7fffff00) {
    iVar1 = (*sqlite3Config.m.xSize)(pOld);
    iVar2 = (*sqlite3Config.m.xRoundup)((int)nBytes);
    if (iVar2 == iVar1) {
      return pOld;
    }
    if (sqlite3Config.bMemstat != 0) {
      if (mem0.mutex != (sqlite3_mutex *)0x0) {
        (*sqlite3Config.mutex.xMutexEnter)(mem0.mutex);
      }
      if (sqlite3Stat.mxValue[5] < (long)nBytes) {
        sqlite3Stat.mxValue[5] = nBytes;
      }
      if (((iVar2 - iVar1 != 0 && iVar1 <= iVar2) && (0 < mem0.alarmThreshold)) &&
         ((long)(mem0.alarmThreshold - (ulong)(uint)(iVar2 - iVar1)) <= sqlite3Stat.nowValue[0])) {
        if (mem0.mutex != (sqlite3_mutex *)0x0) {
          (*sqlite3Config.mutex.xMutexLeave)(mem0.mutex);
        }
        if (mem0.mutex != (sqlite3_mutex *)0x0) {
          (*sqlite3Config.mutex.xMutexEnter)(mem0.mutex);
        }
      }
      pvVar3 = (*sqlite3Config.m.xRealloc)(pOld,iVar2);
      if ((pvVar3 == (void *)0x0) && (0 < mem0.alarmThreshold)) {
        if (mem0.mutex != (sqlite3_mutex *)0x0) {
          (*sqlite3Config.mutex.xMutexLeave)(mem0.mutex);
        }
        if (mem0.mutex != (sqlite3_mutex *)0x0) {
          (*sqlite3Config.mutex.xMutexEnter)(mem0.mutex);
        }
        pvVar3 = (*sqlite3Config.m.xRealloc)(pOld,iVar2);
      }
      if (pvVar3 != (void *)0x0) {
        iVar2 = (*sqlite3Config.m.xSize)(pvVar3);
        sqlite3Stat.nowValue[0] = (iVar2 - iVar1) + sqlite3Stat.nowValue[0];
        if (sqlite3Stat.mxValue[0] < sqlite3Stat.nowValue[0]) {
          sqlite3Stat.mxValue[0] = sqlite3Stat.nowValue[0];
        }
      }
      if (mem0.mutex == (sqlite3_mutex *)0x0) {
        return pvVar3;
      }
      (*sqlite3Config.mutex.xMutexLeave)(mem0.mutex);
      return pvVar3;
    }
    pvVar3 = (*sqlite3Config.m.xRealloc)(pOld,iVar2);
    return pvVar3;
  }
  return (void *)0x0;
}

Assistant:

SQLITE_PRIVATE void *sqlite3Realloc(void *pOld, u64 nBytes){
  int nOld, nNew, nDiff;
  void *pNew;
  assert( sqlite3MemdebugHasType(pOld, MEMTYPE_HEAP) );
  assert( sqlite3MemdebugNoType(pOld, (u8)~MEMTYPE_HEAP) );
  if( pOld==0 ){
    return sqlite3Malloc(nBytes); /* IMP: R-04300-56712 */
  }
  if( nBytes==0 ){
    sqlite3_free(pOld); /* IMP: R-26507-47431 */
    return 0;
  }
  if( nBytes>=0x7fffff00 ){
    /* The 0x7ffff00 limit term is explained in comments on sqlite3Malloc() */
    return 0;
  }
  nOld = sqlite3MallocSize(pOld);
  /* IMPLEMENTATION-OF: R-46199-30249 SQLite guarantees that the second
  ** argument to xRealloc is always a value returned by a prior call to
  ** xRoundup. */
  nNew = sqlite3GlobalConfig.m.xRoundup((int)nBytes);
  if( nOld==nNew ){
    pNew = pOld;
  }else if( sqlite3GlobalConfig.bMemstat ){
    sqlite3_mutex_enter(mem0.mutex);
    sqlite3StatusHighwater(SQLITE_STATUS_MALLOC_SIZE, (int)nBytes);
    nDiff = nNew - nOld;
    if( nDiff>0 && sqlite3StatusValue(SQLITE_STATUS_MEMORY_USED) >= 
          mem0.alarmThreshold-nDiff ){
      sqlite3MallocAlarm(nDiff);
    }
    pNew = sqlite3GlobalConfig.m.xRealloc(pOld, nNew);
    if( pNew==0 && mem0.alarmThreshold>0 ){
      sqlite3MallocAlarm((int)nBytes);
      pNew = sqlite3GlobalConfig.m.xRealloc(pOld, nNew);
    }
    if( pNew ){
      nNew = sqlite3MallocSize(pNew);
      sqlite3StatusUp(SQLITE_STATUS_MEMORY_USED, nNew-nOld);
    }
    sqlite3_mutex_leave(mem0.mutex);
  }else{
    pNew = sqlite3GlobalConfig.m.xRealloc(pOld, nNew);
  }
  assert( EIGHT_BYTE_ALIGNMENT(pNew) ); /* IMP: R-11148-40995 */
  return pNew;
}